

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# segments.cpp
# Opt level: O1

void __thiscall r_comp::Reference::Reference(Reference *this,uintptr_t i,Class *c,Class *cc)

{
  pointer pcVar1;
  undefined3 uVar2;
  Iteration IVar3;
  
  this->index = i;
  uVar2 = *(undefined3 *)&c->field_0x1;
  (this->_class).atom = c->atom;
  *(undefined3 *)&(this->_class).field_0x1 = uVar2;
  (this->_class).str_opcode._M_dataplus._M_p = (pointer)&(this->_class).str_opcode.field_2;
  pcVar1 = (c->str_opcode)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->_class).str_opcode,pcVar1,pcVar1 + (c->str_opcode)._M_string_length);
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::vector
            (&(this->_class).things_to_read,&c->things_to_read);
  IVar3 = c->use_as;
  (this->_class).type = c->type;
  (this->_class).use_as = IVar3;
  uVar2 = *(undefined3 *)&cc->field_0x1;
  (this->cast_class).atom = cc->atom;
  *(undefined3 *)&(this->cast_class).field_0x1 = uVar2;
  (this->cast_class).str_opcode._M_dataplus._M_p = (pointer)&(this->cast_class).str_opcode.field_2;
  pcVar1 = (cc->str_opcode)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(this->cast_class).str_opcode,pcVar1,
             pcVar1 + (cc->str_opcode)._M_string_length);
  std::vector<r_comp::StructureMember,_std::allocator<r_comp::StructureMember>_>::vector
            (&(this->cast_class).things_to_read,&cc->things_to_read);
  IVar3 = cc->use_as;
  (this->cast_class).type = cc->type;
  (this->cast_class).use_as = IVar3;
  return;
}

Assistant:

Reference::Reference(const uintptr_t i, const Class &c, const Class &cc): index(i), _class(c), cast_class(cc)
{
}